

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

ConcatNDLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_concatnd(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x3d4) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x3d4;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x20);
    ConcatNDLayerParams::ConcatNDLayerParams(this_00.concatnd_);
    (this->layer_).concatnd_ = (ConcatNDLayerParams *)this_00;
  }
  return (ConcatNDLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::ConcatNDLayerParams* NeuralNetworkLayer::mutable_concatnd() {
  if (!has_concatnd()) {
    clear_layer();
    set_has_concatnd();
    layer_.concatnd_ = new ::CoreML::Specification::ConcatNDLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.concatND)
  return layer_.concatnd_;
}